

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ObjLevelId(Gia_Man_t *p,int Id)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  
  pVVar2 = p->vLevels;
  if (Id < pVVar2->nSize) goto LAB_0072846b;
  iVar4 = Id + 1;
  iVar1 = pVVar2->nCap;
  iVar5 = iVar1 * 2;
  if (Id < iVar5) {
    if (iVar1 < iVar5 && iVar1 <= Id) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar3 = (int *)realloc(pVVar2->pArray,(long)iVar1 << 3);
      }
      pVVar2->pArray = piVar3;
LAB_00728439:
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = iVar5;
    }
  }
  else if (iVar1 <= Id) {
    if (pVVar2->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)iVar4 << 2);
    }
    else {
      piVar3 = (int *)realloc(pVVar2->pArray,(long)iVar4 << 2);
    }
    pVVar2->pArray = piVar3;
    iVar5 = iVar4;
    goto LAB_00728439;
  }
  iVar1 = pVVar2->nSize;
  if (iVar1 <= Id) {
    memset(pVVar2->pArray + iVar1,0,(ulong)(uint)(Id - iVar1) * 4 + 4);
  }
  pVVar2->nSize = iVar4;
LAB_0072846b:
  if ((-1 < Id) && (Id < pVVar2->nSize)) {
    return pVVar2->pArray[(uint)Id];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Gia_ObjLevelId( Gia_Man_t * p, int Id )             { return Vec_IntGetEntry(p->vLevels, Id);                    }